

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.h
# Opt level: O1

void __thiscall
dlib::list_box_helper::list_box<std::__cxx11::string>::
load<dlib::queue_sort_1<dlib::queue_kernel_c<dlib::queue_kernel_1<std::__cxx11::string,dlib::memory_manager_stateless_kernel_1<char>>>>>
          (list_box<std::__cxx11::string> *this,
          queue_sort_1<dlib::queue_kernel_c<dlib::queue_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>_>
          *list)

{
  array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  *this_00;
  long lVar1;
  ulong uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  unsigned_long height;
  long lVar4;
  ulong width;
  auto_mutex M;
  auto_mutex local_40;
  
  local_40.r = *(rmutex **)(this + 0x28);
  local_40.m = (mutex *)0x0;
  local_40.rw = (read_write_mutex *)0x0;
  rmutex::lock(local_40.r,1);
  this_00 = (array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
             *)(this + 0x1260);
  array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  ::clear(this_00);
  iVar3 = (*(list->
            super_queue_kernel_c<dlib::queue_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
            ).
            super_queue_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
            .
            super_enumerable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._vptr_enumerable[8])(list);
  array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  ::set_max_size(this_00,CONCAT44(extraout_var,iVar3));
  iVar3 = (*(list->
            super_queue_kernel_c<dlib::queue_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
            ).
            super_queue_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
            .
            super_enumerable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._vptr_enumerable[8])(list);
  array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  ::set_size(this_00,CONCAT44(extraout_var_00,iVar3));
  (*(list->
    super_queue_kernel_c<dlib::queue_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
    ).
    super_queue_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
    .
    super_enumerable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._vptr_enumerable[3])(list);
  lVar4 = 0;
  width = 0;
  height = 0;
  while( true ) {
    iVar3 = (*(list->
              super_queue_kernel_c<dlib::queue_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
              ).
              super_queue_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
              .
              super_enumerable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._vptr_enumerable[7])(list);
    if ((char)iVar3 == '\0') break;
    *(undefined1 *)(*(long *)(this + 0x1280) + 0x20 + lVar4) = 0;
    (*(list->
      super_queue_kernel_c<dlib::queue_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
      ).
      super_queue_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
      .
      super_enumerable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._vptr_enumerable[5])(list);
    std::__cxx11::string::_M_assign((string *)(*(long *)(this + 0x1280) + lVar4));
    lVar1 = *(long *)(this + 0x1280);
    font::compute_size<char,std::char_traits<char>,std::allocator<char>>
              (*(font **)(this + 0x50),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar1 + lVar4),
               (unsigned_long *)(lVar1 + lVar4 + 0x28),(unsigned_long *)(lVar1 + lVar4 + 0x30),0,
               0xffffffffffffffff);
    uVar2 = *(ulong *)(*(long *)(this + 0x1280) + 0x28 + lVar4);
    if (width < uVar2) {
      width = uVar2;
    }
    height = height + *(long *)(*(long *)(this + 0x1280) + 0x30 + lVar4);
    lVar4 = lVar4 + 0x38;
  }
  scrollable_region::set_total_rect_size((scrollable_region *)this,width,height);
  base_window::invalidate_rectangle(*(base_window **)(this + 0x30),(rectangle *)(this + 8));
  *(undefined8 *)(this + 0x12b0) = 0;
  auto_mutex::unlock(&local_40);
  return;
}

Assistant:

void load (
            const T& list
        )
        {
            auto_mutex M(m);
            items.clear();
            unsigned long i = 0;
            items.set_max_size(list.size());
            items.set_size(list.size());
            list.reset();
            unsigned long max_width = 0;
            unsigned long total_height = 0;
            while (list.move_next())
            {
                items[i].is_selected = false;
                items[i].name = list.element();
                mfont->compute_size(items[i].name,items[i].width, items[i].height);

                if (items[i].width > max_width)
                    max_width = items[i].width;
                total_height += items[i].height;

                ++i;
            }
            set_total_rect_size(max_width, total_height);

            parent.invalidate_rectangle(rect);
            last_selected = 0;
        }